

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

double __thiscall
soplex::SVectorBase<double>::operator*(SVectorBase<double> *this,VectorBase<double> *w)

{
  Nonzero<double> *pNVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  pNVar1 = this->m_elem;
  dVar4 = 0.0;
  dVar3 = 0.0;
  for (iVar2 = this->memused; 0 < iVar2; iVar2 = iVar2 + -1) {
    dVar5 = pNVar1->val *
            (w->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[pNVar1->idx];
    dVar6 = dVar3 + dVar5;
    dVar4 = dVar4 + (dVar5 - (dVar6 - dVar3)) + (dVar3 - (dVar6 - (dVar6 - dVar3)));
    pNVar1 = pNVar1 + 1;
    dVar3 = dVar6;
  }
  return dVar3 + dVar4;
}

Assistant:

inline
R SVectorBase<R>::operator*(const VectorBase<R>& w) const
{
   StableSum<R> x;
   Nonzero<R>* e = m_elem;

   for(int i = size() - 1; i >= 0; --i)
   {
      x += e->val * w[e->idx];
      e++;
   }

   return x;
}